

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O2

QAccessibleInterface * __thiscall QAccessibleMenu::parent(QAccessibleMenu *this)

{
  QObject **ppQVar1;
  QMenu *pQVar2;
  QMenuBar *pQVar3;
  qsizetype qVar4;
  long lVar5;
  long lVar6;
  QWidget *unaff_R12;
  long in_FS_OFFSET;
  QAction *menuAction;
  QArrayDataPointer<QAction_*> local_90;
  QArrayDataPointer<QObject_*> local_78;
  QArrayDataPointer<QObject_*> local_58;
  QAction *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = menu(this);
  local_40 = QMenu::menuAction(pQVar2);
  if (local_40 != (QAction *)0x0) {
    local_58.d = (Data *)0x0;
    local_58.ptr = (QObject **)0x0;
    local_58.size = 0;
    local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.ptr = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
    QAction::associatedObjects();
    QList<QObject_*>::reserve((QList<QObject_*> *)&local_58,(qsizetype)(local_78.size + 1));
    pQVar2 = menu(this);
    QList<QObject_*>::append
              ((QList<QObject_*> *)&local_58,
               *(parameter_type *)(*(long *)&(pQVar2->super_QWidget).field_0x8 + 0x10));
    QList<QObject_*>::append((QList<QObject_*> *)&local_58,(QList<QObject_*> *)&local_78);
    ppQVar1 = local_58.ptr;
    lVar6 = local_58.size << 3;
    for (lVar5 = 0; lVar6 != lVar5; lVar5 = lVar5 + 8) {
      unaff_R12 = *(QWidget **)((long)ppQVar1 + lVar5);
      pQVar2 = QtPrivate::qobject_cast_helper<QMenu*,QObject>(&unaff_R12->super_QObject);
      if (pQVar2 == (QMenu *)0x0) {
        pQVar3 = QtPrivate::qobject_cast_helper<QMenuBar*,QObject>(&unaff_R12->super_QObject);
        if (pQVar3 != (QMenuBar *)0x0) goto LAB_004cdf94;
      }
      else {
LAB_004cdf94:
        QWidget::actions((QList<QAction_*> *)&local_90,unaff_R12);
        qVar4 = QtPrivate::indexOf<QAction*,QAction*>((QList<QAction_*> *)&local_90,&local_40,0);
        QArrayDataPointer<QAction_*>::~QArrayDataPointer(&local_90);
        if (qVar4 != -1) {
          unaff_R12 = (QWidget *)getOrCreateMenu(unaff_R12,local_40);
          break;
        }
      }
    }
    QArrayDataPointer<QObject_*>::~QArrayDataPointer(&local_78);
    QArrayDataPointer<QObject_*>::~QArrayDataPointer(&local_58);
    if (lVar6 != lVar5) goto LAB_004cdffd;
  }
  unaff_R12 = (QWidget *)QAccessibleWidget::parent(&this->super_QAccessibleWidget);
LAB_004cdffd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QAccessibleInterface *)unaff_R12;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleInterface *QAccessibleMenu::parent() const
{
    if (QAction *menuAction = menu()->menuAction()) {
        QList<QObject *> parentCandidates;
        const QList<QObject *> associatedObjects = menuAction->associatedObjects();
        parentCandidates.reserve(associatedObjects.size() + 1);
        parentCandidates << menu()->parentWidget() << associatedObjects;
        for (QObject *object : std::as_const(parentCandidates)) {
            if (qobject_cast<QMenu*>(object)
#if QT_CONFIG(menubar)
                || qobject_cast<QMenuBar*>(object)
#endif
                ) {
                QWidget *widget = static_cast<QWidget*>(object);
                if (widget->actions().indexOf(menuAction) != -1)
                    return getOrCreateMenu(widget, menuAction);
            }
        }
    }
    return QAccessibleWidget::parent();
}